

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_pcm_rb_data_source__on_read
                    (ma_data_source *pDataSource,void *pFramesOut,ma_uint64 frameCount,
                    ma_uint64 *pFramesRead)

{
  uint sizeInFrames;
  ma_result mVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  size_t __n;
  int __c;
  void *__dest;
  ma_uint64 mVar5;
  long lVar6;
  ma_uint32 mappedFrameCount;
  void *pMappedBuffer;
  uint local_44;
  ma_uint64 *local_40;
  void *local_38;
  
  mVar5 = 0;
  local_40 = pFramesRead;
  if (frameCount != 0) {
    while( true ) {
      uVar2 = frameCount - mVar5;
      if (0xfffffffe < uVar2) {
        uVar2 = 0xffffffff;
      }
      local_44 = (uint)uVar2;
      mVar1 = ma_pcm_rb_acquire_read((ma_pcm_rb *)pDataSource,&local_44,&local_38);
      sizeInFrames = local_44;
      if ((mVar1 != MA_SUCCESS) || (uVar2 = (ulong)local_44, local_44 == 0)) break;
      uVar3 = (ulong)(uint)(*(int *)(&DAT_0017b4a0 + (ulong)*(uint *)((long)pDataSource + 0x88) * 4)
                           * *(int *)((long)pDataSource + 0x8c));
      __dest = (void *)(mVar5 * uVar3 + (long)pFramesOut);
      if (__dest != local_38) {
        memcpy(__dest,local_38,uVar3 * uVar2);
      }
      mVar1 = ma_pcm_rb_commit_read((ma_pcm_rb *)pDataSource,sizeInFrames);
      if ((mVar1 != MA_SUCCESS) || (mVar5 = mVar5 + uVar2, frameCount <= mVar5)) break;
    }
  }
  lVar4 = frameCount - mVar5;
  if (mVar5 <= frameCount && lVar4 != 0) {
    uVar2 = (ulong)(*(int *)(&DAT_0017b4a0 + (ulong)*(uint *)((long)pDataSource + 0x88) * 4) *
                   *(uint *)((long)pDataSource + 0x8c));
    lVar6 = mVar5 * uVar2;
    mVar5 = frameCount;
    if ((ulong)*(uint *)((long)pDataSource + 0x88) == 1) {
      __n = lVar4 * (ulong)*(uint *)((long)pDataSource + 0x8c);
      if (__n == 0) goto LAB_001621a2;
      __c = 0x80;
    }
    else {
      if ((pFramesOut == (void *)0x0) || (__n = lVar4 * uVar2, __n == 0)) goto LAB_001621a2;
      __c = 0;
    }
    memset((void *)(lVar6 + (long)pFramesOut),__c,__n);
  }
LAB_001621a2:
  *local_40 = mVar5;
  return MA_SUCCESS;
}

Assistant:

static ma_result ma_pcm_rb_data_source__on_read(ma_data_source* pDataSource, void* pFramesOut, ma_uint64 frameCount, ma_uint64* pFramesRead)
{
    /* Since there's no notion of an end, we don't ever want to return MA_AT_END here. But it is possible to return 0. */
    ma_pcm_rb* pRB = (ma_pcm_rb*)pDataSource;
    ma_result result;
    ma_uint64 totalFramesRead;

    MA_ASSERT(pRB != NULL);

    /* We need to run this in a loop since the ring buffer itself may loop. */
    totalFramesRead = 0;
    while (totalFramesRead < frameCount) {
        void* pMappedBuffer;
        ma_uint32 mappedFrameCount;
        ma_uint64 framesToRead = frameCount - totalFramesRead;
        if (framesToRead > 0xFFFFFFFF) {
            framesToRead = 0xFFFFFFFF;
        }

        mappedFrameCount = (ma_uint32)framesToRead;
        result = ma_pcm_rb_acquire_read(pRB, &mappedFrameCount, &pMappedBuffer);
        if (result != MA_SUCCESS) {
            break;
        }

        if (mappedFrameCount == 0) {
            break;  /* <-- End of ring buffer. */
        }

        ma_copy_pcm_frames(ma_offset_pcm_frames_ptr(pFramesOut, totalFramesRead, pRB->format, pRB->channels), pMappedBuffer, mappedFrameCount, pRB->format, pRB->channels);

        result = ma_pcm_rb_commit_read(pRB, mappedFrameCount);
        if (result != MA_SUCCESS) {
            break;
        }

        totalFramesRead += mappedFrameCount;
    }

    /*
    There is no notion of an "end" in a ring buffer. If we didn't have enough data to fill the requested frame
    count we'll need to pad with silence. If we don't do this, totalFramesRead might equal 0 which will result
    in the data source layer at a higher level translating this to MA_AT_END which is incorrect for a ring buffer.
    */
    if (totalFramesRead < frameCount) {
        ma_silence_pcm_frames(ma_offset_pcm_frames_ptr(pFramesOut, totalFramesRead, pRB->format, pRB->channels), (frameCount - totalFramesRead), pRB->format, pRB->channels);
        totalFramesRead = frameCount;
    }

    *pFramesRead = totalFramesRead;
    return MA_SUCCESS;
}